

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canonical_encoders.cc
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
hanabi_learning_env::CanonicalObservationEncoder::Shape(CanonicalObservationEncoder *this)

{
  initializer_list<int> __l;
  int iVar1;
  int iVar2;
  int iVar3;
  AgentObservationType AVar4;
  vector<int,_std::allocator<int>_> *in_RSI;
  HanabiGame *in_RDI;
  HanabiGame *in_stack_ffffffffffffff90;
  int local_64;
  HanabiGame *game;
  undefined1 in_stack_ffffffffffffffcc [12];
  int local_24;
  int *local_20;
  undefined8 local_18;
  
  game = in_RDI;
  iVar1 = anon_unknown_4::HandsSectionLength(in_stack_ffffffffffffff90);
  iVar2 = anon_unknown_4::BoardSectionLength(game);
  iVar1 = iVar1 + iVar2;
  iVar2 = anon_unknown_4::DiscardSectionLength((HanabiGame *)0x1578bc);
  iVar2 = iVar1 + iVar2;
  iVar3 = anon_unknown_4::LastActionSectionLength(game);
  iVar3 = iVar2 + iVar3;
  AVar4 = HanabiGame::ObservationType
                    ((HanabiGame *)
                     (in_RSI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish);
  if (AVar4 == kMinimal) {
    local_64 = 0;
  }
  else {
    local_64 = anon_unknown_4::CardKnowledgeSectionLength(in_stack_ffffffffffffff90);
  }
  local_24 = iVar3 + local_64;
  local_20 = &local_24;
  local_18 = 1;
  std::allocator<int>::allocator((allocator<int> *)0x15793f);
  __l._4_12_ = in_stack_ffffffffffffffcc;
  __l._M_array._0_4_ = iVar3;
  std::vector<int,_std::allocator<int>_>::vector(in_RSI,__l,(allocator_type *)CONCAT44(iVar2,iVar1))
  ;
  std::allocator<int>::~allocator((allocator<int> *)0x157964);
  return (vector<int,_std::allocator<int>_> *)in_RDI;
}

Assistant:

std::vector<int> CanonicalObservationEncoder::Shape() const {
  return {HandsSectionLength(*parent_game_) +
          BoardSectionLength(*parent_game_) +
          DiscardSectionLength(*parent_game_) +
          LastActionSectionLength(*parent_game_) +
          (parent_game_->ObservationType() == HanabiGame::kMinimal
               ? 0
               : CardKnowledgeSectionLength(*parent_game_))};
}